

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qipaddress.cpp
# Opt level: O2

QChar * QIPAddressUtils::parseIp6(IPv6Address *address,QChar *begin,QChar *end)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  QChar *pQVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  long lVar13;
  long in_FS_OFFSET;
  QSimpleParsedNumber<unsigned_long_long> QVar14;
  IPv4Address ip4;
  undefined1 local_90 [32];
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_90._16_8_ = local_90 + 0x18;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_90._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_90._0_8_ = 0x40;
  local_90._8_8_ = 0;
  pQVar7 = checkedToAscii((Buffer *)local_90,begin,end);
  uVar3 = local_90._16_8_;
  uVar2 = local_90._8_8_;
  if (pQVar7 == (QChar *)0x0) {
    iVar11 = 0;
    iVar5 = 0;
    pcVar12 = (char *)local_90._16_8_;
    do {
      cVar1 = *pcVar12;
      if (cVar1 == ':') {
        iVar11 = iVar11 + 1;
      }
      else if (cVar1 == '\0') goto LAB_0022e01f;
      iVar5 = iVar5 + (uint)(cVar1 == '.');
      pcVar12 = pcVar12 + 1;
    } while( true );
  }
LAB_0022e18f:
  QVarLengthArray<char,_64LL>::~QVarLengthArray((QVarLengthArray<char,_64LL> *)local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar7;
LAB_0022e01f:
  pQVar7 = end;
  if ((iVar5 == 3) || (iVar5 == 0)) {
    *(quint8 *)((long)address + 0) = '\0';
    *(quint8 *)((long)address + 1) = '\0';
    *(quint8 *)((long)address + 2) = '\0';
    *(quint8 *)((long)address + 3) = '\0';
    *(quint8 *)((long)address + 4) = '\0';
    *(quint8 *)((long)address + 5) = '\0';
    *(quint8 *)((long)address + 6) = '\0';
    *(quint8 *)((long)address + 7) = '\0';
    *(quint8 *)((long)address + 8) = '\0';
    *(quint8 *)((long)address + 9) = '\0';
    *(quint8 *)((long)address + 10) = '\0';
    *(quint8 *)((long)address + 0xb) = '\0';
    *(quint8 *)((long)address + 0xc) = '\0';
    *(quint8 *)((long)address + 0xd) = '\0';
    *(quint8 *)((long)address + 0xe) = '\0';
    *(quint8 *)((long)address + 0xf) = '\0';
    if ((long)end - (long)begin != 4 || iVar11 != 2) {
      iVar6 = 9;
      if (((*(char *)local_90._16_8_ != ':') || (*(char *)(local_90._16_8_ + 1) != ':')) &&
         ((lVar9 = (long)end - (long)begin >> 1, *(char *)(local_90._16_8_ + lVar9 + -2) != ':' ||
          (*(char *)(local_90._16_8_ + lVar9 + -1) != ':')))) {
        if (iVar11 - 8U < 0xfffffffa) goto LAB_0022e18f;
        iVar6 = 8;
      }
      iVar10 = 0;
      iVar6 = (-iVar11 - (uint)(iVar5 != 0)) + iVar6;
      pcVar12 = (char *)local_90._16_8_;
LAB_0022e0b2:
      lVar13 = (long)iVar10;
      lVar9 = 0;
      do {
        lVar8 = lVar13 + lVar9;
        if (0xe < lVar8) {
LAB_0022e183:
          if ((int)lVar8 == 0x10) {
            pQVar7 = (QChar *)0x0;
          }
          goto LAB_0022e18f;
        }
        if (*pcVar12 == ':') goto LAB_0022e12d;
        QVar14 = qstrntoull(pcVar12,(qsizetype)(uVar3 + (uVar2 - (long)pcVar12)),0x10);
        lVar8 = QVar14.used;
        if (lVar8 - 5U < 0xfffffffffffffffc) goto LAB_0022e1ce;
        if (pcVar12[lVar8] == '.') {
          if (lVar13 + lVar9 != 0xc) goto LAB_0022e1ce;
          ip4 = 0xaaaaaaaa;
          bVar4 = parseIp4Internal(&ip4,pcVar12,false);
          if (!bVar4) {
            pQVar7 = begin + ((long)pcVar12 - local_90._16_8_);
            goto LAB_0022e18f;
          }
          *(IPv4Address *)(*address + 0xc) =
               ip4 >> 0x18 | (ip4 & 0xff0000) >> 8 | (ip4 & 0xff00) << 8 | ip4 << 0x18;
          break;
        }
        (*address)[lVar9 + lVar13] = QVar14.result._1_1_;
        (*address)[lVar9 + lVar13 + 1] = (quint8)QVar14.result;
        cVar1 = pcVar12[lVar8];
        if (cVar1 != ':') {
          if (cVar1 == '\0') {
            lVar8 = lVar13 + lVar9 + 2;
            goto LAB_0022e183;
          }
          pQVar7 = begin + ((long)(pcVar12 + lVar8) - local_90._16_8_);
          goto LAB_0022e18f;
        }
        pcVar12 = pcVar12 + lVar8 + 1;
        lVar9 = lVar9 + 2;
      } while( true );
    }
    pQVar7 = (QChar *)0x0;
  }
  goto LAB_0022e18f;
LAB_0022e12d:
  if (iVar6 < 1) goto LAB_0022e1ce;
  if ((lVar13 + lVar9 == 0) || (iVar11 * 2 - iVar10 == (int)lVar9)) {
    if (pcVar12[1] != ':') goto LAB_0022e1ce;
    pcVar12 = pcVar12 + 1;
  }
  iVar10 = (int)lVar9 + iVar10 + iVar6 * 2;
  pcVar12 = pcVar12 + 1;
  iVar6 = 0;
  goto LAB_0022e0b2;
LAB_0022e1ce:
  pQVar7 = begin + ((long)pcVar12 - local_90._16_8_);
  goto LAB_0022e18f;
}

Assistant:

const QChar *parseIp6(IPv6Address &address, const QChar *begin, const QChar *end)
{
    Q_ASSERT(begin != end);
    Buffer buffer;
    const QChar *ret = checkedToAscii(buffer, begin, end);
    if (ret)
        return ret;

    const char *ptr = buffer.data();
    const char *const stop = ptr + buffer.size();

    // count the colons
    int colonCount = 0;
    int dotCount = 0;
    while (*ptr) {
        if (*ptr == ':')
            ++colonCount;
        if (*ptr == '.')
            ++dotCount;
        ++ptr;
    }
    // IPv4-in-IPv6 addresses are stricter in what they accept
    if (dotCount != 0 && dotCount != 3)
        return end;

    memset(address, 0, sizeof address);
    if (colonCount == 2 && end - begin == 2) // "::"
        return nullptr;

    // if there's a double colon ("::"), this is how many zeroes it means
    int zeroWordsToFill;
    ptr = buffer.data();

    // there are two cases where 8 colons are allowed: at the ends
    // so test that before the colon-count test
    if ((ptr[0] == ':' && ptr[1] == ':') ||
            (ptr[end - begin - 2] == ':' && ptr[end - begin - 1] == ':')) {
        zeroWordsToFill = 9 - colonCount;
    } else if (colonCount < 2 || colonCount > 7) {
        return end;
    } else {
        zeroWordsToFill = 8 - colonCount;
    }
    if (dotCount)
        --zeroWordsToFill;

    int pos = 0;
    while (pos < 15) {
        if (*ptr == ':') {
            // empty field, we hope it's "::"
            if (zeroWordsToFill < 1)
                return begin + (ptr - buffer.data());
            if (pos == 0 || pos == colonCount * 2) {
                if (ptr[0] == '\0' || ptr[1] != ':')
                    return begin + (ptr - buffer.data());
                ++ptr;
            }
            pos += zeroWordsToFill * 2;
            zeroWordsToFill = 0;
            ++ptr;
            continue;
        }

        auto [ll, used] = qstrntoull(ptr, stop - ptr, 16);
        quint16 x = ll;

        // Reject malformed fields:
        // - failed to parse
        // - too many hex digits
        if (used <= 0 || used > 4)
            return begin + (ptr - buffer.data());

        if (ptr[used] == '.') {
            // this could be an IPv4 address
            // it's only valid in the last element
            if (pos != 12)
                return begin + (ptr - buffer.data());

            IPv4Address ip4;
            if (!parseIp4Internal(ip4, ptr, false))
                return begin + (ptr - buffer.data());

            address[12] = ip4 >> 24;
            address[13] = ip4 >> 16;
            address[14] = ip4 >> 8;
            address[15] = ip4;
            return nullptr;
        }

        address[pos++] = x >> 8;
        address[pos++] = x & 0xff;

        if (ptr[used] == '\0')
            break;
        if (ptr[used] != ':')
            return begin + (used + ptr - buffer.data());
        ptr += used + 1;
    }
    return pos == 16 ? nullptr : end;
}